

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

void __thiscall USBControlTransferParser::ParseStandardDescriptor(USBControlTransferParser *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference puVar3;
  byte *pbVar4;
  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
  local_60;
  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
  local_58;
  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
  local_50;
  __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
  local_48;
  undefined1 local_40 [8];
  USBCtrlTransFieldFrame f;
  USBStructField *descFields;
  USBControlTransferParser *this_local;
  
  f._32_8_ = 0;
  if (this->mDescType == DT_DEVICE) {
    f._32_8_ = DeviceDescriptorFields;
  }
  else if (this->mDescType == DT_DEVICE_QUALIFIER) {
    f._32_8_ = DeviceQualifierDescriptorFields;
  }
  else if ((this->mDescType == DT_CONFIGURATION) ||
          (this->mDescType == DT_OTHER_SPEED_CONFIGURATION)) {
    f._32_8_ = ConfigurationDescriptorFields;
  }
  else if (this->mDescType == DT_INTERFACE) {
    f._32_8_ = InterfaceDescriptorFields;
  }
  else if (this->mDescType == DT_ENDPOINT) {
    f._32_8_ = EndpointDescriptorFields;
  }
  else if ((this->mDescType == DT_HID) &&
          (pmVar2 = std::
                    map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                    ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber),
          *pmVar2 == CC_HID)) {
    f._32_8_ = HIDDescriptorFields;
  }
  else if ((this->mDescType == DT_CDC_CS_INTERFACE) ||
          ((this->mDescType == DT_CDC_CS_ENDPOINT &&
           ((pmVar2 = std::
                      map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                      ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber),
            *pmVar2 == CC_CommunicationsAndCDCControl ||
            (pmVar2 = std::
                      map<unsigned_char,_USBClassCodes,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
                      ::operator[](&this->mInterfaceClasses,&this->mInterfaceNumber),
            *pmVar2 == CC_CDCData)))))) {
    if (this->mDescSubtype == DST_HEADER) {
      f._32_8_ = CDCHeaderFields;
    }
    else if (this->mDescSubtype == DST_CALL_MANAGEMENT) {
      f._32_8_ = CDCCallManagementFields;
    }
    else if (this->mDescSubtype == DST_ABSTRACT_CONTROL_MANAGEMENT) {
      f._32_8_ = CDCAbstractControlManagementFields;
    }
    else if (this->mDescSubtype == DST_DIRECT_LINE_MANAGEMENT) {
      f._32_8_ = CDCDirectLineManagementFields;
    }
    else if (this->mDescSubtype == DST_TELEPHONE_RINGER) {
      f._32_8_ = CDCTelephoneRingerFields;
    }
    else if (this->mDescSubtype == DST_TELEPHONE_CALL_AND_LINE_STATE) {
      f._32_8_ = CDCTelephoneCallStateReportingFields;
    }
    else if (this->mDescSubtype == DST_UNION) {
      f._32_8_ = CDCUnionFields;
    }
    else if (this->mDescSubtype == DST_COUNTRY_SELECTION) {
      f._32_8_ = CDCCountrySelectionFields;
    }
    else if (this->mDescSubtype == DST_TELEPHONE_OPERATIONAL_MODES) {
      f._32_8_ = CDCTelephoneOperationalModesFields;
    }
    else if (this->mDescSubtype == DST_USB_TERMINAL) {
      f._32_8_ = CDCUSBTerminalFields;
    }
    else if (this->mDescSubtype == DST_NETWORK_CHANNEL_TERMINAL) {
      f._32_8_ = CDCNetworkChannelTerminalFields;
    }
    else if (this->mDescSubtype == DST_PROTOCOL_UNIT) {
      f._32_8_ = CDCProtocolUnitFields;
    }
    else if (this->mDescSubtype == DST_EXTENSION_UNIT) {
      f._32_8_ = CDCExtensionUnitFields;
    }
    else if (this->mDescSubtype == DST_MULTI_CHANNEL_MANAGEMENT) {
      f._32_8_ = CDCMultiChannelFields;
    }
    else if (this->mDescSubtype == DST_CAPI_CONTROL_MANAGEMENT) {
      f._32_8_ = CDCCAPIControlFields;
    }
    else if (this->mDescSubtype == DST_ETHERNET_NETWORKING) {
      f._32_8_ = CDCEthernetNetworkingFields;
    }
    else if (this->mDescSubtype == DST_ATM_NETWORKING) {
      f._32_8_ = CDCATMNetworkingFields;
    }
  }
  if (f._32_8_ != 0) {
    ParseStructure(this,(USBStructField *)f._32_8_);
  }
  while( true ) {
    bVar1 = false;
    if (this->mParsedOffset < this->mDescBytes) {
      bVar1 = this->mPacketOffset < this->mPacketDataBytes;
    }
    if (!bVar1) break;
    USBCtrlTransFieldFrame::USBCtrlTransFieldFrame((USBCtrlTransFieldFrame *)local_40);
    f._25_1_ = 0;
    local_50._M_current =
         (unsigned_long_long *)
         std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::begin
                   (&this->pPacket->mBitBeginSamples);
    local_48 = __gnu_cxx::
               __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
               ::operator+(&local_50,(long)(this->mPacketOffset * 8 + 0x10));
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
             ::operator*(&local_48);
    local_40 = (undefined1  [8])*puVar3;
    local_60._M_current =
         (unsigned_long_long *)
         std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::begin
                   (&this->pPacket->mBitBeginSamples);
    local_58 = __gnu_cxx::
               __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
               ::operator+(&local_60,(long)(this->mPacketOffset * 8 + 0x18));
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
             ::operator*(&local_58);
    f._0_8_ = *puVar3;
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->pPacket->mData,(long)(this->mPacketOffset + 2));
    USBCtrlTransFieldFrame::PackFrame
              ((USBCtrlTransFieldFrame *)local_40,(uint)*pbVar4,'\x01',this->mAddress,Fld_None,
               "byte");
    AnalyzerResults::AddFrame((Frame *)this->pResults);
    this->mPacketOffset = this->mPacketOffset + 1;
    this->mParsedOffset = this->mParsedOffset + 1;
    USBCtrlTransFieldFrame::~USBCtrlTransFieldFrame((USBCtrlTransFieldFrame *)local_40);
  }
  if (this->mDescBytes == this->mParsedOffset) {
    this->mParsedOffset = 0;
    this->mDescType = DT_Undefined;
  }
  return;
}

Assistant:

void USBControlTransferParser::ParseStandardDescriptor()
{
    USBStructField* descFields = NULL;
    if( mDescType == DT_DEVICE )
        descFields = DeviceDescriptorFields;
    else if( mDescType == DT_DEVICE_QUALIFIER )
        descFields = DeviceQualifierDescriptorFields;
    else if( mDescType == DT_CONFIGURATION || mDescType == DT_OTHER_SPEED_CONFIGURATION )
        descFields = ConfigurationDescriptorFields;
    else if( mDescType == DT_INTERFACE )
        descFields = InterfaceDescriptorFields;
    else if( mDescType == DT_ENDPOINT )
        descFields = EndpointDescriptorFields;
    else if( mDescType == DT_HID && mInterfaceClasses[ mInterfaceNumber ] == CC_HID )
        descFields = HIDDescriptorFields;
    else if( mDescType == DT_CDC_CS_INTERFACE ||
             mDescType == DT_CDC_CS_ENDPOINT && ( mInterfaceClasses[ mInterfaceNumber ] == CC_CommunicationsAndCDCControl ||
                                                  mInterfaceClasses[ mInterfaceNumber ] == CC_CDCData ) )
    {
        if( mDescSubtype == DST_HEADER )
            descFields = CDCHeaderFields;
        else if( mDescSubtype == DST_CALL_MANAGEMENT )
            descFields = CDCCallManagementFields;
        else if( mDescSubtype == DST_ABSTRACT_CONTROL_MANAGEMENT )
            descFields = CDCAbstractControlManagementFields;
        else if( mDescSubtype == DST_DIRECT_LINE_MANAGEMENT )
            descFields = CDCDirectLineManagementFields;
        else if( mDescSubtype == DST_TELEPHONE_RINGER )
            descFields = CDCTelephoneRingerFields;
        else if( mDescSubtype == DST_TELEPHONE_CALL_AND_LINE_STATE )
            descFields = CDCTelephoneCallStateReportingFields;
        else if( mDescSubtype == DST_UNION )
            descFields = CDCUnionFields;
        else if( mDescSubtype == DST_COUNTRY_SELECTION )
            descFields = CDCCountrySelectionFields;
        else if( mDescSubtype == DST_TELEPHONE_OPERATIONAL_MODES )
            descFields = CDCTelephoneOperationalModesFields;
        else if( mDescSubtype == DST_USB_TERMINAL )
            descFields = CDCUSBTerminalFields;
        else if( mDescSubtype == DST_NETWORK_CHANNEL_TERMINAL )
            descFields = CDCNetworkChannelTerminalFields;
        else if( mDescSubtype == DST_PROTOCOL_UNIT )
            descFields = CDCProtocolUnitFields;
        else if( mDescSubtype == DST_EXTENSION_UNIT )
            descFields = CDCExtensionUnitFields;
        else if( mDescSubtype == DST_MULTI_CHANNEL_MANAGEMENT )
            descFields = CDCMultiChannelFields;
        else if( mDescSubtype == DST_CAPI_CONTROL_MANAGEMENT )
            descFields = CDCCAPIControlFields;
        else if( mDescSubtype == DST_ETHERNET_NETWORKING )
            descFields = CDCEthernetNetworkingFields;
        else if( mDescSubtype == DST_ATM_NETWORKING )
            descFields = CDCATMNetworkingFields;
    }

    if( descFields )
        ParseStructure( descFields );

    // parse the rest of the descriptor or packet as raw bytes

    while( mDescBytes > mParsedOffset            // more bytes in descriptor?
           && mPacketDataBytes > mPacketOffset ) // more data in packet?
    {
        USBCtrlTransFieldFrame f;
        f.mFlags = FF_None;
        f.mStartingSampleInclusive = *( pPacket->mBitBeginSamples.begin() + ( mPacketOffset + 2 ) * 8 );
        f.mEndingSampleInclusive = *( pPacket->mBitBeginSamples.begin() + ( mPacketOffset + 3 ) * 8 );

        f.PackFrame( pPacket->mData[ mPacketOffset + 2 ], 1, mAddress, Fld_None, "byte" );

        pResults->AddFrame( f );

        ++mPacketOffset;
        ++mParsedOffset;
    }

    // reset the parser if we have completeted parsing the descriptor
    if( mDescBytes == mParsedOffset )
    {
        mParsedOffset = 0;
        mDescType = DT_Undefined;
    }
}